

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CasesSimp.cpp
# Opt level: O0

VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TermList>_> __thiscall
Inferences::CasesSimp::RewriteableSubtermsFn::operator()(RewriteableSubtermsFn *this,Literal *lit)

{
  Term *in_RDX;
  BooleanSubtermIt *in_RSI;
  IteratorCore<std::pair<Kernel::Literal_*,_Kernel::TermList>_> *in_RDI;
  IteratorCore<Kernel::TermList> *in_stack_ffffffffffffff88;
  VirtualIterator<Kernel::TermList> *this_00;
  VirtualIterator<Kernel::TermList> *in_stack_ffffffffffffffb8;
  VirtualIterator<Kernel::TermList> *in_stack_ffffffffffffffc0;
  VirtualIterator<Kernel::TermList> in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffe7;
  
  ::operator_new(0x38);
  Kernel::BooleanSubtermIt::BooleanSubtermIt(in_RSI,in_RDX,(bool)in_stack_ffffffffffffffe7);
  this_00 = (VirtualIterator<Kernel::TermList> *)&stack0xffffffffffffffc8;
  Lib::vi<Kernel::TermList>(in_stack_ffffffffffffff88);
  Lib::getUniquePersistentIterator<Lib::VirtualIterator<Kernel::TermList>>
            (in_stack_ffffffffffffffb8);
  Lib::pushPairIntoRightIterator<Kernel::Literal*,Lib::VirtualIterator<Kernel::TermList>>
            ((Literal *)in_stack_ffffffffffffffc8._core,in_stack_ffffffffffffffc0);
  Lib::
  pvi<Lib::MappingIterator<Lib::VirtualIterator<Kernel::TermList>,Lib::PairRightPushingFn<Kernel::Literal*,Kernel::TermList>,std::pair<Kernel::Literal*,Kernel::TermList>>>
            ((MappingIterator<Lib::VirtualIterator<Kernel::TermList>,_Lib::PairRightPushingFn<Kernel::Literal_*,_Kernel::TermList>,_std::pair<Kernel::Literal_*,_Kernel::TermList>_>
              *)in_stack_ffffffffffffffc8._core);
  Lib::
  MappingIterator<Lib::VirtualIterator<Kernel::TermList>,_Lib::PairRightPushingFn<Kernel::Literal_*,_Kernel::TermList>,_std::pair<Kernel::Literal_*,_Kernel::TermList>_>
  ::~MappingIterator((MappingIterator<Lib::VirtualIterator<Kernel::TermList>,_Lib::PairRightPushingFn<Kernel::Literal_*,_Kernel::TermList>,_std::pair<Kernel::Literal_*,_Kernel::TermList>_>
                      *)0x78cfa3);
  Lib::VirtualIterator<Kernel::TermList>::~VirtualIterator(this_00);
  Lib::VirtualIterator<Kernel::TermList>::~VirtualIterator(this_00);
  return (VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TermList>_>)in_RDI;
}

Assistant:

VirtualIterator<pair<Literal*, TermList> > operator()(Literal* lit)
  {
    return pvi( pushPairIntoRightIterator(lit, 
                getUniquePersistentIterator(vi(new BooleanSubtermIt(lit)))));
  }